

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *param_1,Hasher *h,VkRenderPassMultiviewCreateInfo *create_info)

{
  uint local_2c;
  uint local_28;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  VkRenderPassMultiviewCreateInfo *create_info_local;
  Hasher *h_local;
  StateRecorder *param_0_local;
  
  Hasher::u32(h,create_info->subpassCount);
  for (i_2 = 0; i_2 < create_info->subpassCount; i_2 = i_2 + 1) {
    Hasher::u32(h,create_info->pViewMasks[i_2]);
  }
  Hasher::u32(h,create_info->dependencyCount);
  for (local_28 = 0; local_28 < create_info->dependencyCount; local_28 = local_28 + 1) {
    Hasher::s32(h,create_info->pViewOffsets[local_28]);
  }
  Hasher::u32(h,create_info->correlationMaskCount);
  for (local_2c = 0; local_2c < create_info->correlationMaskCount; local_2c = local_2c + 1) {
    Hasher::u32(h,create_info->pCorrelationMasks[local_2c]);
  }
  return;
}

Assistant:

static void hash_pnext_struct(const StateRecorder *,
                              Hasher &h,
                              const VkRenderPassMultiviewCreateInfo &create_info)
{
	h.u32(create_info.subpassCount);
	for (uint32_t i = 0; i < create_info.subpassCount; i++)
		h.u32(create_info.pViewMasks[i]);
	h.u32(create_info.dependencyCount);
	for (uint32_t i = 0; i < create_info.dependencyCount; i++)
		h.s32(create_info.pViewOffsets[i]);
	h.u32(create_info.correlationMaskCount);
	for (uint32_t i = 0; i < create_info.correlationMaskCount; i++)
		h.u32(create_info.pCorrelationMasks[i]);
}